

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O0

GLuint deqp::gls::TextureSamplerTest::createTexture(Functions *gl,GLenum target)

{
  GLenum target_local;
  Functions *gl_local;
  
  if (target == 0xde1) {
    gl_local._4_4_ = createTexture2D(gl);
  }
  else if (target == 0x806f) {
    gl_local._4_4_ = createTexture3D(gl);
  }
  else if (target == 0x8513) {
    gl_local._4_4_ = createTextureCube(gl);
  }
  else {
    gl_local._4_4_ = 0xffffffff;
  }
  return gl_local._4_4_;
}

Assistant:

GLuint TextureSamplerTest::createTexture (const glw::Functions& gl, GLenum target)
{
	switch (target)
	{
		case GL_TEXTURE_2D:
			return createTexture2D(gl);

		case GL_TEXTURE_3D:
			return createTexture3D(gl);

		case GL_TEXTURE_CUBE_MAP:
			return createTextureCube(gl);

		default:
			DE_ASSERT(false);
			return (GLuint)-1;
	}
}